

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  value_type_conflict *__val;
  ostream *this;
  size_t sVar6;
  int iVar7;
  string *input_stream;
  char *__s;
  initializer_list<double> __l;
  int num_element;
  int num_data;
  double entropy;
  vector<double,_std::allocator<double>_> average_entropy;
  ostringstream error_message_4;
  StatisticsAccumulation statistics_accumulation;
  vector<double,_std::allocator<double>_> probability;
  EntropyCalculation entropy_calculation;
  Buffer buffer;
  ifstream ifs;
  int local_4dc;
  string local_4d8;
  EntropyUnits local_4b4;
  ulong local_4b0;
  int local_4a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  vector<double,_std::allocator<double>_> local_498;
  string local_478 [3];
  ios_base local_408 [264];
  StatisticsAccumulation local_300;
  vector<double,_std::allocator<double>_> local_2e8;
  EntropyCalculation local_2d0;
  Buffer local_2b8;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_4dc = 0x100;
  paVar1 = &local_478[0].field_2;
  local_4b0 = 0;
  local_4b4 = kBit;
  iVar7 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"l:o:fh",(option *)0x0,(int *)0x0);
    if (9 < iVar5 - 0x66U) {
      if (iVar5 != -1) goto switchD_00103771_caseD_67;
      iVar5 = 2;
      goto LAB_00103a16;
    }
    switch(iVar5) {
    case 0x66:
      local_4b0 = CONCAT71((int7)((ulong)((long)&switchD_00103771::switchdataD_0010d004 +
                                         (long)(int)(&switchD_00103771::switchdataD_0010d004)
                                                    [iVar5 - 0x66U]) >> 8),1);
      goto LAB_00103a14;
    default:
switchD_00103771_caseD_67:
      anon_unknown.dwarf_3014::PrintUsage((ostream *)&std::cerr);
LAB_0010391f:
      iVar5 = 1;
      iVar7 = 1;
      break;
    case 0x68:
      anon_unknown.dwarf_3014::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar5 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_478);
      bVar4 = sptk::ConvertStringToInteger(&local_238,&local_4dc);
      bVar2 = local_4dc < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar4 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_478[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_478[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        goto LAB_0010391f;
      }
LAB_00103a14:
      iVar5 = 0;
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_478);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_2b8);
      if (bVar2) {
        bVar2 = sptk::IsInRange((EntropyUnits)local_2b8._vptr_Buffer,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00103950;
        iVar5 = 4;
        bVar2 = true;
        local_4b4 = (EntropyUnits)local_2b8._vptr_Buffer;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
LAB_00103950:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        this = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
        std::ostream::operator<<((ostream *)this,2);
        local_478[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_478[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar5 = 1;
        bVar2 = false;
        iVar7 = 1;
      }
      if (bVar2) goto LAB_00103a14;
    }
LAB_00103a16:
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (bVar2) {
        input_stream = &local_238;
        std::ifstream::ifstream(input_stream);
        if ((__s == (char *)0x0) ||
           (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
           (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          sptk::StatisticsAccumulation::StatisticsAccumulation(&local_300,0,1,false,false);
          sptk::StatisticsAccumulation::Buffer::Buffer(&local_2b8);
          sptk::EntropyCalculation::EntropyCalculation(&local_2d0,local_4dc,local_4b4);
          if ((local_300.is_valid_ == true) && (local_2d0.is_valid_ != false)) {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_2e8,(long)local_4dc,(allocator_type *)local_478);
LAB_00103cc2:
            do {
              bVar2 = sptk::ReadStream<double>
                                (false,0,0,local_4dc,&local_2e8,(istream *)input_stream,(int *)0x0);
              if (!bVar2) {
                bVar2 = sptk::StatisticsAccumulation::GetNumData(&local_300,&local_2b8,&local_4a4);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_478,"Failed to accumulate statistics",0x1f);
                  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","")
                  ;
                  sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
                  goto LAB_00104088;
                }
                if (((local_4b0 & 1) == 0) && (0 < local_4a4)) {
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)operator_new(8);
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  *local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start = 0.0;
                  local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  bVar2 = sptk::StatisticsAccumulation::GetMean(&local_300,&local_2b8,&local_498);
                  if (bVar2) {
                    bVar4 = sptk::WriteStream<double>
                                      (0,1,&local_498,(ostream *)&std::cout,(int *)0x0);
                    bVar2 = true;
                    if (!bVar4) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_478,"Failed to write entropy",0x17);
                      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4d8,"entropy","");
                      sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
                      goto LAB_00104125;
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_478,"Failed to calculate entropy",0x1b);
                    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_4d8,"entropy","");
                    sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
LAB_00104125:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                      operator_delete(local_4d8._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
                    std::ios_base::~ios_base(local_408);
                    iVar7 = 1;
                    bVar2 = false;
                  }
                  if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (!bVar2) goto LAB_001040ba;
                }
                iVar7 = 0;
                goto LAB_001040ba;
              }
              bVar2 = sptk::EntropyCalculation::Run(&local_2d0,&local_2e8,(double *)&local_4a0);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_478,"Failed to calculate entropy",0x1b);
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
                sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
                goto LAB_00104088;
              }
              if ((local_4b0 & 1) != 0) {
                bVar2 = sptk::WriteStream<double>((double)local_4a0,(ostream *)&std::cout);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_478,"Failed to write entropy",0x17);
                  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","")
                  ;
                  sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
                  goto LAB_00104088;
                }
                goto LAB_00103cc2;
              }
              local_4d8._M_dataplus._M_p = (pointer)local_4a0;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_4d8;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)local_478,__l,
                         (allocator_type *)&local_498);
              bVar2 = sptk::StatisticsAccumulation::Run
                                (&local_300,(vector<double,_std::allocator<double>_> *)local_478,
                                 &local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478[0]._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_478[0]._M_dataplus._M_p);
              }
            } while (bVar2);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_478,"Failed to accumulate statistics",0x1f);
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
            sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
LAB_00104088:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
            std::ios_base::~ios_base(local_408);
            iVar7 = 1;
LAB_001040ba:
            if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_478,"Failed to initialize EntropyCalculation",0x27);
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
            sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
            std::ios_base::~ios_base(local_408);
            iVar7 = 1;
          }
          sptk::StatisticsAccumulation::Buffer::~Buffer(&local_2b8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_478,"Cannot open file ",0x11);
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar6);
          local_2b8._vptr_Buffer = (_func_int **)&local_2b8.first_order_statistics_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"entropy","");
          sptk::PrintErrorMessage((string *)&local_2b8,(ostringstream *)local_478);
          if ((vector<double,_std::allocator<double>_> *)local_2b8._vptr_Buffer !=
              &local_2b8.first_order_statistics_) {
            operator_delete(local_2b8._vptr_Buffer);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
          std::ios_base::~ios_base(local_408);
          iVar7 = 1;
        }
        std::ifstream::~ifstream(&local_238);
        return iVar7;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Cannot set translation mode",0x1b);
      local_478[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
      sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Too many input files",0x14);
      local_478[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
      sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_478[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_element(kDefaultNumElement);
  sptk::EntropyCalculation::EntropyUnits entropy_unit(kDefaultEntropyUnit);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_element) ||
            num_element <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(
                          sptk::EntropyCalculation::EntropyUnits::kNumUnits) -
                      1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        entropy_unit = static_cast<sptk::EntropyCalculation::EntropyUnits>(tmp);
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation statistics_accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  sptk::EntropyCalculation entropy_calculation(num_element, entropy_unit);
  if (!statistics_accumulation.IsValid() || !entropy_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize EntropyCalculation";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::vector<double> probability(num_element);
  double entropy;

  while (sptk::ReadStream(false, 0, 0, num_element, &probability, &input_stream,
                          NULL)) {
    if (!entropy_calculation.Run(probability, &entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }

    if (output_frame_by_frame) {
      if (!sptk::WriteStream(entropy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write entropy";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    } else {
      if (!statistics_accumulation.Run(std::vector<double>{entropy}, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    }
  }

  int num_data;
  if (!statistics_accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  if (!output_frame_by_frame && 0 < num_data) {
    std::vector<double> average_entropy(1);
    if (!statistics_accumulation.GetMean(buffer, &average_entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, 1, average_entropy, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }

  return 0;
}